

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.h
# Opt level: O2

Dec_Edge_t Dec_GraphAddNodeAnd(Dec_Graph_t *pGraph,Dec_Edge_t eEdge0,Dec_Edge_t eEdge1)

{
  Dec_Node_t *pDVar1;
  
  pDVar1 = Dec_GraphAppendNode(pGraph);
  pDVar1->eEdge0 = eEdge0;
  pDVar1->eEdge1 = eEdge1;
  *(uint *)&pDVar1->field_0x10 =
       ((uint)eEdge1 & 1) << 0x10 | ((uint)eEdge0 & 1) << 0xf |
       *(uint *)&pDVar1->field_0x10 & 0xfffe7fff;
  return (Dec_Edge_t)(pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe);
}

Assistant:

static inline Dec_Edge_t Dec_GraphAddNodeAnd( Dec_Graph_t * pGraph, Dec_Edge_t eEdge0, Dec_Edge_t eEdge1 )
{
    Dec_Node_t * pNode;
    // get the new node
    pNode = Dec_GraphAppendNode( pGraph );
    // set the inputs and other info
    pNode->eEdge0 = eEdge0;
    pNode->eEdge1 = eEdge1;
    pNode->fCompl0 = eEdge0.fCompl;
    pNode->fCompl1 = eEdge1.fCompl;
    return Dec_EdgeCreate( pGraph->nSize - 1, 0 );
}